

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

int libssh2_knownhost_writefile(LIBSSH2_KNOWNHOSTS *hosts,char *filename,int type)

{
  size_t sVar1;
  size_t nwrote;
  size_t wrote;
  char buffer [4092];
  int rc;
  FILE *file;
  known_host *node;
  int type_local;
  char *filename_local;
  LIBSSH2_KNOWNHOSTS *hosts_local;
  
  buffer[0xff4] = '\0';
  buffer[0xff5] = '\0';
  buffer[0xff6] = '\0';
  buffer[0xff7] = '\0';
  if (type == 1) {
    register0x00000000 = fopen(filename,"w");
    if (register0x00000000 == (FILE *)0x0) {
      hosts_local._4_4_ = _libssh2_error(hosts->session,-0x10,"Failed to open file");
    }
    else {
      for (file = (FILE *)_libssh2_list_first(&hosts->head); file != (FILE *)0x0;
          file = (FILE *)_libssh2_list_next((list_node *)file)) {
        nwrote = 0;
        buffer._4084_4_ =
             knownhost_writeline(hosts,(known_host *)file,(char *)&wrote,0xffc,&nwrote,1);
        if (buffer._4084_4_ != 0) break;
        sVar1 = fwrite(&wrote,1,nwrote,stack0xffffffffffffffc8);
        if (sVar1 != nwrote) {
          buffer._4084_4_ = _libssh2_error(hosts->session,-0x10,"Write failed");
          break;
        }
      }
      fclose(stack0xffffffffffffffc8);
      hosts_local._4_1_ = buffer[0xff4];
      hosts_local._5_1_ = buffer[0xff5];
      hosts_local._6_1_ = buffer[0xff6];
      hosts_local._7_1_ = buffer[0xff7];
    }
  }
  else {
    hosts_local._4_4_ =
         _libssh2_error(hosts->session,-0x21,"Unsupported type of known-host information store");
  }
  return hosts_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_writefile(LIBSSH2_KNOWNHOSTS *hosts,
                            const char *filename, int type)
{
    struct known_host *node;
    FILE *file;
    int rc = LIBSSH2_ERROR_NONE;
    char buffer[4092];

    /* we only support this single file type for now, bail out on all other
       attempts */
    if(type != LIBSSH2_KNOWNHOST_FILE_OPENSSH)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host information "
                              "store");

    file = fopen(filename, FOPEN_WRITETEXT);
    if(!file)
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_FILE,
                              "Failed to open file");

    for(node = _libssh2_list_first(&hosts->head);
        node;
        node = _libssh2_list_next(&node->node)) {
        size_t wrote = 0;
        size_t nwrote;
        rc = knownhost_writeline(hosts, node, buffer, sizeof(buffer), &wrote,
                                 type);
        if(rc)
            break;

        nwrote = fwrite(buffer, 1, wrote, file);
        if(nwrote != wrote) {
            /* failed to write the whole thing, bail out */
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_FILE,
                                "Write failed");
            break;
        }
    }
    fclose(file);

    return rc;
}